

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O2

AssertionResult __thiscall
testing::internal::PredicateFormatterFromMatcher<google::protobuf::EqualsProtoMatcherP<char_const*>>
::operator()(void *this,char *value_text,FeatureSet *x)

{
  bool bVar1;
  ostream *poVar2;
  AssertionResult *other;
  FeatureSet *in_RCX;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX;
  AssertionResult AVar3;
  Matcher<const_google::protobuf::FeatureSet_&> matcher;
  stringstream ss;
  StringMatchResultListener listener;
  AssertionResult AStack_388;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_378;
  MatcherBase<const_google::protobuf::FeatureSet_&> local_358;
  stringstream local_340 [16];
  ostream local_330 [376];
  StringMatchResultListener local_1b8;
  
  MatcherBaseImpl<google::protobuf::EqualsProtoMatcherP<char_const*>>::
  Apply<google::protobuf::FeatureSet_const&,0ul>(&local_358);
  bVar1 = MatcherBase<const_google::protobuf::FeatureSet_&>::Matches(&local_358,in_RCX);
  if (bVar1) {
    AssertionSuccess();
  }
  else {
    std::__cxx11::stringstream::stringstream(local_340);
    poVar2 = std::operator<<(local_330,"Value of: ");
    poVar2 = std::operator<<(poVar2,(char *)x);
    poVar2 = std::operator<<(poVar2,"\n");
    std::operator<<(poVar2,"Expected: ");
    MatcherBase<const_google::protobuf::FeatureSet_&>::DescribeTo(&local_358,local_330);
    StringMatchResultListener::StringMatchResultListener(&local_1b8);
    bVar1 = MatchPrintAndExplain<google::protobuf::FeatureSet_const,google::protobuf::FeatureSet_const&>
                      (in_RCX,(Matcher<const_google::protobuf::FeatureSet_&> *)&local_358,
                       &local_1b8.super_MatchResultListener);
    if (bVar1) {
      std::operator<<(local_330,
                      "\n  The matcher failed on the initial attempt; but passed when rerun to generate the explanation."
                     );
    }
    poVar2 = std::operator<<(local_330,"\n  Actual: ");
    std::__cxx11::stringbuf::str();
    std::operator<<(poVar2,(string *)&local_378);
    std::__cxx11::string::~string((string *)&local_378);
    AssertionFailure();
    std::__cxx11::stringbuf::str();
    other = AssertionResult::operator<<(&AStack_388,&local_378);
    AssertionResult::AssertionResult((AssertionResult *)this,other);
    std::__cxx11::string::~string((string *)&local_378);
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&AStack_388.message_);
    StringMatchResultListener::~StringMatchResultListener(&local_1b8);
    std::__cxx11::stringstream::~stringstream(local_340);
  }
  MatcherBase<const_google::protobuf::FeatureSet_&>::~MatcherBase(&local_358);
  AVar3.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       extraout_RDX._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl;
  AVar3._0_8_ = this;
  return AVar3;
}

Assistant:

AssertionResult operator()(const char* value_text, const T& x) const {
    // We convert matcher_ to a Matcher<const T&> *now* instead of
    // when the PredicateFormatterFromMatcher object was constructed,
    // as matcher_ may be polymorphic (e.g. NotNull()) and we won't
    // know which type to instantiate it to until we actually see the
    // type of x here.
    //
    // We write SafeMatcherCast<const T&>(matcher_) instead of
    // Matcher<const T&>(matcher_), as the latter won't compile when
    // matcher_ has type Matcher<T> (e.g. An<int>()).
    // We don't write MatcherCast<const T&> either, as that allows
    // potentially unsafe downcasting of the matcher argument.
    const Matcher<const T&> matcher = SafeMatcherCast<const T&>(matcher_);

    // The expected path here is that the matcher should match (i.e. that most
    // tests pass) so optimize for this case.
    if (matcher.Matches(x)) {
      return AssertionSuccess();
    }

    ::std::stringstream ss;
    ss << "Value of: " << value_text << "\n"
       << "Expected: ";
    matcher.DescribeTo(&ss);

    // Rerun the matcher to "PrintAndExplain" the failure.
    StringMatchResultListener listener;
    if (MatchPrintAndExplain(x, matcher, &listener)) {
      ss << "\n  The matcher failed on the initial attempt; but passed when "
            "rerun to generate the explanation.";
    }
    ss << "\n  Actual: " << listener.str();
    return AssertionFailure() << ss.str();
  }